

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_sink.c
# Opt level: O0

void sink_sweep_ins(jit_State *J)

{
  ushort uVar1;
  uint uVar2;
  IRIns *pIVar3;
  IRIns *pIVar4;
  jit_State *in_RDI;
  IRIns *ira_1;
  int delta;
  IRIns *ira;
  IRIns *irfirst;
  IRIns *ir;
  int local_3c;
  IRIns *local_10;
  
  pIVar3 = (in_RDI->cur).ir;
  uVar2 = (in_RDI->cur).nk;
  for (local_10 = (in_RDI->cur).ir + ((in_RDI->cur).nins - 1); pIVar3 + uVar2 <= local_10;
      local_10 = local_10 + -1) {
    switch((local_10->field_1).o) {
    case '\x13':
      pIVar4 = (in_RDI->cur).ir;
      uVar1 = (local_10->field_0).op2;
      if ((((&pIVar4->field_1)[uVar1].t.irt & 0x20) == 0) &&
         (((((&pIVar4->field_1)[uVar1].o == 'N' || ((&pIVar4->field_1)[uVar1].o == 'O')) ||
           ((&pIVar4->field_1)[uVar1].o == 'P')) || ((&pIVar4->field_1)[uVar1].o == 'Q')))) {
        (local_10->field_0).prev = 0xfe;
      }
      else {
        (local_10->field_0).prev = 0xff;
      }
      break;
    default:
      (local_10->field_1).t.irt = (local_10->field_1).t.irt & 0xdf;
      (local_10->field_0).prev = 0xff;
      break;
    case ';':
      if ((*(byte *)((long)(in_RDI->cur).ir + (ulong)(local_10->field_0).op1 * 8 + 4) & 0x20) == 0)
      {
        (local_10->field_0).prev = 0xfe;
      }
      else {
        (local_10->field_1).t.irt = (local_10->field_1).t.irt & 0xdf;
        (local_10->field_0).prev = 0xff;
      }
      break;
    case 'G':
    case 'H':
    case 'J':
    case 'K':
      pIVar4 = sink_checkalloc(in_RDI,local_10);
      if ((pIVar4 == (IRIns *)0x0) || (((pIVar4->field_1).t.irt & 0x20) != 0)) {
        (local_10->field_0).prev = 0xff;
      }
      else {
        local_3c = (int)((long)local_10 - (long)pIVar4 >> 3);
        if (0xff < local_3c) {
          local_3c = 0xff;
        }
        (local_10->field_0).prev = (short)(local_3c << 8) + 0xfe;
      }
      break;
    case 'N':
    case 'O':
    case 'P':
    case 'Q':
      if (((local_10->field_1).t.irt & 0x20) == 0) {
        (local_10->field_1).t.irt = (local_10->field_1).t.irt & 0x7f;
        (local_10->field_0).prev = 0xfe;
        (in_RDI->cur).sinktags = '\x01';
      }
      else {
        (local_10->field_1).t.irt = (local_10->field_1).t.irt & 0xdf;
        (local_10->field_0).prev = 0xff;
      }
    }
  }
  return;
}

Assistant:

static void sink_sweep_ins(jit_State *J)
{
  IRIns *ir, *irfirst = IR(J->cur.nk);
  for (ir = IR(J->cur.nins-1) ; ir >= irfirst; ir--) {
    switch (ir->o) {
    case IR_ASTORE: case IR_HSTORE: case IR_FSTORE: case IR_XSTORE: {
      IRIns *ira = sink_checkalloc(J, ir);
      if (ira && !irt_ismarked(ira->t)) {
	int delta = (int)(ir - ira);
	ir->prev = REGSP(RID_SINK, delta > 255 ? 255 : delta);
      } else {
	ir->prev = REGSP_INIT;
      }
      break;
      }
    case IR_NEWREF:
      if (!irt_ismarked(IR(ir->op1)->t)) {
	ir->prev = REGSP(RID_SINK, 0);
      } else {
	irt_clearmark(ir->t);
	ir->prev = REGSP_INIT;
      }
      break;
#if LJ_HASFFI
    case IR_CNEW: case IR_CNEWI:
#endif
    case IR_TNEW: case IR_TDUP:
      if (!irt_ismarked(ir->t)) {
	ir->t.irt &= ~IRT_GUARD;
	ir->prev = REGSP(RID_SINK, 0);
	J->cur.sinktags = 1;  /* Signal present SINK tags to assembler. */
      } else {
	irt_clearmark(ir->t);
	ir->prev = REGSP_INIT;
      }
      break;
    case IR_PHI: {
      IRIns *ira = IR(ir->op2);
      if (!irt_ismarked(ira->t) &&
	  (ira->o == IR_TNEW || ira->o == IR_TDUP ||
	   (LJ_HASFFI && (ira->o == IR_CNEW || ira->o == IR_CNEWI)))) {
	ir->prev = REGSP(RID_SINK, 0);
      } else {
	ir->prev = REGSP_INIT;
      }
      break;
      }
    default:
      irt_clearmark(ir->t);
      ir->prev = REGSP_INIT;
      break;
    }
  }
}